

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rtprandom.cpp
# Opt level: O2

RTPRandom * jrtplib::RTPRandom::CreateDefaultRandomNumberGenerator(void)

{
  int iVar1;
  RTPRandomURandom *this;
  
  this = (RTPRandomURandom *)operator_new(0x10);
  RTPRandomURandom::RTPRandomURandom(this);
  iVar1 = RTPRandomURandom::Init(this);
  if (iVar1 < 0) {
    (*(this->super_RTPRandom)._vptr_RTPRandom[1])(this);
    this = (RTPRandomURandom *)operator_new(0x10);
    RTPRandomRand48::RTPRandomRand48((RTPRandomRand48 *)this);
  }
  return &this->super_RTPRandom;
}

Assistant:

RTPRandom *RTPRandom::CreateDefaultRandomNumberGenerator()
{
#ifdef RTP_HAVE_RAND_S
	RTPRandomRandS *r = new RTPRandomRandS();
#else
	RTPRandomURandom *r = new RTPRandomURandom();
#endif // RTP_HAVE_RAND_S
	RTPRandom *rRet = r;

	if (r->Init() < 0) // fall back to rand48
	{
		delete r;
		rRet = new RTPRandomRand48();
	}
	
	return rRet;
}